

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O2

string * __thiscall cmCTest::CurrentTime_abi_cxx11_(string *__return_storage_ptr__,cmCTest *this)

{
  tm *__tp;
  ostream *poVar1;
  char *__format;
  time_t currenttime;
  ostringstream cmCTestLog_msg;
  char current_time [1024];
  char *local_5b8 [4];
  time_t local_598;
  string local_590 [11];
  char local_418 [1024];
  
  local_598 = time((time_t *)0x0);
  __tp = localtime(&local_598);
  __format = "%a %b %d %H:%M:%S %Z %Y";
  if (this->ShortDateFormat != false) {
    __format = "%b %d %H:%M %Z";
  }
  strftime(local_418,1000,__format,__tp);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_590);
  poVar1 = std::operator<<((ostream *)local_590,"   Current_Time: ");
  poVar1 = std::operator<<(poVar1,local_418);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::stringbuf::str();
  Log(this,0,
      "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmCTest.cxx"
      ,0x9c,local_5b8[0],false);
  std::__cxx11::string::~string((string *)local_5b8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_590);
  std::__cxx11::string::string((string *)local_590,local_418,(allocator *)local_5b8);
  CleanString(__return_storage_ptr__,local_590);
  std::__cxx11::string::~string((string *)local_590);
  return __return_storage_ptr__;
}

Assistant:

std::string cmCTest::CurrentTime()
{
  time_t currenttime = time(0);
  struct tm* t = localtime(&currenttime);
  //return ::CleanString(ctime(&currenttime));
  char current_time[1024];
  if ( this->ShortDateFormat )
    {
    strftime(current_time, 1000, "%b %d %H:%M %Z", t);
    }
  else
    {
    strftime(current_time, 1000, "%a %b %d %H:%M:%S %Z %Y", t);
    }
  cmCTestLog(this, DEBUG, "   Current_Time: " << current_time << std::endl);
  return cmCTest::CleanString(current_time);
}